

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Parser::StringLiteral(Parser *this,ASTNode **node)

{
  Symbol *pSVar1;
  
  pSVar1 = (Symbol *)operator_new(0x40);
  (pSVar1->id)._M_dataplus._M_p = (pointer)&(pSVar1->id).field_2;
  (pSVar1->id)._M_string_length = 0;
  (pSVar1->id).field_2._M_local_buf[0] = '\0';
  (pSVar1->attributes).super__Vector_base<Attribute,_std::allocator<Attribute>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar1->attributes).super__Vector_base<Attribute,_std::allocator<Attribute>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar1->attributes).super__Vector_base<Attribute,_std::allocator<Attribute>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*node)->symbol = pSVar1;
  std::__cxx11::string::_M_assign((string *)pSVar1);
  pSVar1->datatype = string;
  pSVar1->kind = literal;
  return;
}

Assistant:

void Parser::StringLiteral(ASTNode*& node)
{
	Symbol* sym = semantics.NewSymbol(node);
	sym->id = node->token->payload;
	sym->datatype = SymbolDataType::string;
	sym->kind = SymbolKind::literal; // literals are temporarly stored on the stack(with no particular reference).
	//semantics.AddSymbol(sym);
}